

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

void repackIfAllDigits(char *input,int aonly)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  int v_1;
  int v;
  char *dotpos;
  char *e;
  int alldigits;
  char *s;
  int aonly_local;
  char *input_local;
  
  bVar1 = true;
  _v_1 = (char *)0x0;
  dotpos = input;
  do {
    bVar5 = false;
    if (*dotpos != '\0') {
      bVar5 = *dotpos != '-';
    }
    if (!bVar5) goto LAB_001d29f4;
    if ((*dotpos < '0') || ('9' < *dotpos)) {
      if ((*dotpos != '.') || (_v_1 != (char *)0x0)) {
        bVar1 = false;
LAB_001d29f4:
        pcVar3 = dotpos + -1;
        pcVar4 = dotpos + -2;
        if (((bVar1) && (_v_1 != (char *)0x0)) && (_v_1 < pcVar4)) {
          if (aonly == 0) {
            iVar2 = (*pcVar4 + -0x30) * 10 + *pcVar3 + -0x30;
            *pcVar4 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[iVar2 / 0x22 + 0x1f];
            *pcVar3 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[iVar2 % 0x22];
          }
          else {
            iVar2 = (*input + -0x30) * 100 + (*pcVar4 + -0x30) * 10 + *pcVar3 + -0x30;
            *input = 'A';
            *pcVar4 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[iVar2 / 0x20];
            *pcVar3 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[iVar2 % 0x20];
          }
        }
        return;
      }
      _v_1 = dotpos;
    }
    dotpos = dotpos + 1;
  } while( true );
}

Assistant:

static void repackIfAllDigits(char *input, const int aonly) {
    char *s = input;
    int alldigits = 1; // assume all digits
    char *e;
    char *dotpos = NULL;
    ASSERT(input);
    for (e = s; *e != 0 && *e != '-'; e++) {
        if (*e < '0' || *e > '9') {
            if (*e == '.' && !dotpos) {
                dotpos = e;
            } else {
                alldigits = 0;
                break;
            }
        }
    }
    e--;
    s = e - 1;
    if (alldigits && dotpos &&
        s > dotpos) // e is last char, s is one before, both are beyond dot, all characters are digits
    {
        if (aonly) // v1.50 - encode only using the letter A
        {
            const int v = ((*input) - '0') * 100 + ((*s) - '0') * 10 + ((*e) - '0');
            *input = 'A';
            *s = ENCODE_CHARS[v / 32];
            *e = ENCODE_CHARS[v % 32];
        } else // encode using A,E,U
        {
            const int v = ((*s) - '0') * 10 + ((*e) - '0');
            *s = ENCODE_CHARS[(v / 34) + 31];
            *e = ENCODE_CHARS[v % 34];
        }
    }
}